

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.hh
# Opt level: O0

void __thiscall QPDFObjectHandle::Matrix::Matrix(Matrix *this)

{
  Matrix *this_local;
  
  this->a = 0.0;
  this->b = 0.0;
  this->c = 0.0;
  this->d = 0.0;
  this->e = 0.0;
  this->f = 0.0;
  return;
}

Assistant:

Matrix() :
            a(0.0),
            b(0.0),
            c(0.0),
            d(0.0),
            e(0.0),
            f(0.0)
        {
        }